

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void parsedomain(rnndb *db,char *file,xmlNode *node)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  char *pcVar4;
  char *pcVar5;
  rnndelem *file_00;
  void *pvVar6;
  rnndb *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  rnndelem *delem;
  xmlNode *chain;
  rnndomain *cur;
  int i;
  char *variantsstr;
  char *varsetstr;
  char *prefixstr;
  int bare;
  int width;
  uint64_t size;
  char *name;
  xmlAttr *attr;
  xmlNode *in_stack_ffffffffffffff88;
  xmlAttr *in_stack_ffffffffffffff90;
  xmlAttr *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  rnndb *prVar7;
  char *local_48;
  char *local_40;
  int local_38;
  int local_34;
  uint64_t local_30;
  xmlNode *node_00;
  long lVar8;
  char *file_01;
  
  lVar8._0_4_ = in_RDX->groupsnum;
  lVar8._4_4_ = in_RDX->groupsmax;
  node_00 = (xmlNode *)0x0;
  local_30 = 0;
  local_34 = 8;
  local_38 = 0;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  prVar7 = (rnndb *)0x0;
  for (; lVar8 != 0; lVar8 = *(long *)(lVar8 + 0x30)) {
    iVar1 = strcmp(*(char **)(lVar8 + 0x10),"name");
    if (iVar1 == 0) {
      node_00 = (xmlNode *)
                getattrib((rnndb *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                          in_stack_ffffffffffffff90);
    }
    else {
      iVar1 = strcmp(*(char **)(lVar8 + 0x10),"bare");
      if (iVar1 == 0) {
        local_38 = getboolattrib((rnndb *)CONCAT44(in_stack_ffffffffffffffac,
                                                   in_stack_ffffffffffffffa8),
                                 in_stack_ffffffffffffffa0,
                                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                 in_stack_ffffffffffffff90);
      }
      else {
        iVar1 = strcmp(*(char **)(lVar8 + 0x10),"size");
        if (iVar1 == 0) {
          local_30 = getnumattrib(prVar7,(char *)CONCAT44(in_stack_ffffffffffffffac,
                                                          in_stack_ffffffffffffffa8),
                                  (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                                  in_stack_ffffffffffffff98);
        }
        else {
          iVar1 = strcmp(*(char **)(lVar8 + 0x10),"width");
          if (iVar1 == 0) {
            uVar3 = getnumattrib(prVar7,(char *)CONCAT44(in_stack_ffffffffffffffac,
                                                         in_stack_ffffffffffffffa8),
                                 (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                                 in_stack_ffffffffffffff98);
            local_34 = (int)uVar3;
          }
          else {
            iVar1 = strcmp(*(char **)(lVar8 + 0x10),"prefix");
            if (iVar1 == 0) {
              pcVar4 = getattrib((rnndb *)CONCAT44(in_stack_ffffffffffffffac,
                                                   in_stack_ffffffffffffffa8),
                                 in_stack_ffffffffffffffa0,
                                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                 in_stack_ffffffffffffff90);
              local_40 = strdup(pcVar4);
            }
            else {
              iVar1 = strcmp(*(char **)(lVar8 + 0x10),"varset");
              if (iVar1 == 0) {
                pcVar4 = getattrib((rnndb *)CONCAT44(in_stack_ffffffffffffffac,
                                                     in_stack_ffffffffffffffa8),
                                   in_stack_ffffffffffffffa0,
                                   (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                   in_stack_ffffffffffffff90);
                local_48 = strdup(pcVar4);
              }
              else {
                iVar1 = strcmp(*(char **)(lVar8 + 0x10),"variants");
                if (iVar1 == 0) {
                  pcVar4 = getattrib((rnndb *)CONCAT44(in_stack_ffffffffffffffac,
                                                       in_stack_ffffffffffffffa8),
                                     in_stack_ffffffffffffffa0,
                                     (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                     in_stack_ffffffffffffff90);
                  prVar7 = (rnndb *)strdup(pcVar4);
                }
                else {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for domain\n",in_RSI,
                          (ulong)*(ushort *)&in_RDX->files,*(undefined8 *)(lVar8 + 0x10));
                  *(undefined4 *)(in_RDI + 0x80) = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  if (node_00 == (xmlNode *)0x0) {
    fprintf(_stderr,"%s:%d: nameless domain\n",in_RSI,(ulong)*(ushort *)&in_RDX->files);
    *(undefined4 *)(in_RDI + 0x80) = 1;
  }
  else {
    pcVar4 = (char *)0x0;
    file_01 = (char *)0x0;
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x48); iVar1 = iVar1 + 1) {
      iVar2 = strcmp((char *)**(undefined8 **)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 8),
                     (char *)node_00);
      if (iVar2 == 0) {
        pcVar4 = *(char **)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 8);
        break;
      }
    }
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)calloc(0x80,1);
      pcVar5 = strdup((char *)node_00);
      *(char **)pcVar4 = pcVar5;
      *(int *)(pcVar4 + 8) = local_38;
      *(int *)(pcVar4 + 0xc) = local_34;
      *(uint64_t *)(pcVar4 + 0x10) = local_30;
      *(char **)(pcVar4 + 0x20) = local_40;
      *(char **)(pcVar4 + 0x28) = local_48;
      *(rnndb **)(pcVar4 + 0x30) = prVar7;
      *(undefined8 *)(pcVar4 + 0x78) = in_RSI;
      if (*(int *)(in_RDI + 0x4c) <= *(int *)(in_RDI + 0x48)) {
        if (*(int *)(in_RDI + 0x4c) == 0) {
          *(undefined4 *)(in_RDI + 0x4c) = 0x10;
        }
        else {
          *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x4c) << 1;
        }
        pvVar6 = realloc(*(void **)(in_RDI + 0x40),(long)*(int *)(in_RDI + 0x4c) << 3);
        *(void **)(in_RDI + 0x40) = pvVar6;
      }
      iVar2 = *(int *)(in_RDI + 0x48);
      *(int *)(in_RDI + 0x48) = iVar2 + 1;
      *(char **)(*(long *)(in_RDI + 0x40) + (long)iVar2 * 8) = pcVar4;
    }
    else {
      iVar2 = strdiff((char *)in_stack_ffffffffffffff88,(char *)0x104b1d);
      if (((((iVar2 == 0) &&
            (iVar2 = strdiff((char *)in_stack_ffffffffffffff88,(char *)0x104b35), iVar2 == 0)) &&
           (iVar2 = strdiff((char *)in_stack_ffffffffffffff88,(char *)0x104b4d), iVar2 == 0)) &&
          ((*(int *)(pcVar4 + 0xc) == local_34 && (*(int *)(pcVar4 + 8) == local_38)))) &&
         ((local_30 == 0 ||
          ((*(long *)(pcVar4 + 0x10) == 0 || (local_30 == *(uint64_t *)(pcVar4 + 0x10))))))) {
        if (local_30 != 0) {
          *(uint64_t *)(pcVar4 + 0x10) = local_30;
        }
      }
      else {
        fprintf(_stderr,"%s:%d: merge fail for domain %s\n",in_RSI,(ulong)*(ushort *)&in_RDX->files,
                (in_RDX->copyright).authors);
        *(undefined4 *)(in_RDI + 0x80) = 1;
      }
    }
    for (prVar7 = *(rnndb **)&(in_RDX->copyright).authorsnum; prVar7 != (rnndb *)0x0;
        prVar7 = (rnndb *)prVar7->bitsets) {
      if (*(xmlElementType *)&(prVar7->copyright).license == XML_ELEMENT_NODE) {
        file_00 = trydelem(in_RDX,file_01,node_00);
        if (file_00 == (rnndelem *)0x0) {
          iVar2 = trytop((rnndb *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),pcVar4,(xmlNode *)prVar7
                        );
          if ((iVar2 == 0) &&
             (iVar2 = trydoc(prVar7,(char *)file_00,in_stack_ffffffffffffff88), iVar2 == 0)) {
            fprintf(_stderr,"%s:%d: wrong tag in domain: <%s>\n",in_RSI,
                    (ulong)*(ushort *)&prVar7->files,(prVar7->copyright).authors);
            *(undefined4 *)(in_RDI + 0x80) = 1;
          }
        }
        else {
          if (*(int *)(pcVar4 + 0x6c) <= *(int *)(pcVar4 + 0x68)) {
            if (*(int *)(pcVar4 + 0x6c) == 0) {
              pcVar4[0x6c] = '\x10';
              pcVar4[0x6d] = '\0';
              pcVar4[0x6e] = '\0';
              pcVar4[0x6f] = '\0';
            }
            else {
              *(int *)(pcVar4 + 0x6c) = *(int *)(pcVar4 + 0x6c) << 1;
            }
            pvVar6 = realloc(*(void **)(pcVar4 + 0x60),(long)*(int *)(pcVar4 + 0x6c) << 3);
            *(void **)(pcVar4 + 0x60) = pvVar6;
          }
          iVar2 = *(int *)(pcVar4 + 0x68);
          *(int *)(pcVar4 + 0x68) = iVar2 + 1;
          *(rnndelem **)(*(long *)(pcVar4 + 0x60) + (long)iVar2 * 8) = file_00;
        }
      }
    }
  }
  return;
}

Assistant:

static void parsedomain(struct rnndb *db, char *file, xmlNode *node) {
	xmlAttr *attr = node->properties;
	char *name = 0;
	uint64_t size = 0; int width = 8;
	int bare = 0;
	char *prefixstr = 0;
	char *varsetstr = 0;
	char *variantsstr = 0;
	int i;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			name = getattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "bare")) {
			bare = getboolattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "size")) {
			size = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "width")) {
			width = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "prefix")) {
			prefixstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "varset")) {
			varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for domain\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	if (!name) {
		fprintf (stderr, "%s:%d: nameless domain\n", file, node->line);
		db->estatus = 1;
		return;
	}
	struct rnndomain *cur = 0;
	for (i = 0; i < db->domainsnum; i++)
		if (!strcmp(db->domains[i]->name, name)) {
			cur = db->domains[i];
			break;
		}
	if (cur) {
		if (strdiff(cur->varinfo.prefixstr, prefixstr) ||
				strdiff(cur->varinfo.varsetstr, varsetstr) ||
				strdiff(cur->varinfo.variantsstr, variantsstr) ||
				cur->width != width ||
				cur->bare != bare ||
				(size && cur->size && size != cur->size)) {
			fprintf (stderr, "%s:%d: merge fail for domain %s\n", file, node->line, node->name);
			db->estatus = 1;
		} else {
			if (size)
				cur->size = size;
		}
	} else {
		cur = calloc(sizeof *cur, 1);
		cur->name = strdup(name);
		cur->bare = bare;
		cur->width = width;
		cur->size = size;
		cur->varinfo.prefixstr = prefixstr;
		cur->varinfo.varsetstr = varsetstr;
		cur->varinfo.variantsstr = variantsstr;
		cur->file = file;
		ADDARRAY(db->domains, cur);
	}
	xmlNode *chain = node->children;
	while (chain) {
		struct rnndelem *delem;
		if (chain->type != XML_ELEMENT_NODE) {
		} else if ((delem = trydelem(db, file, chain))) {
			ADDARRAY(cur->subelems, delem);
		} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in domain: <%s>\n", file, chain->line, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
}